

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cpp
# Opt level: O2

void BubbleSort(vector<int,_std::allocator<int>_> *sortArray)

{
  size_type __n;
  int iVar1;
  value_type vVar2;
  value_type vVar3;
  uint uVar4;
  ulong uVar5;
  reference pvVar6;
  ostream *poVar7;
  ulong __n_00;
  
  clock();
  uVar5 = (ulong)((long)(sortArray->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(sortArray->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  while( true ) {
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 0) break;
    __n = 0;
    while (__n_00 = __n, __n_00 < uVar4) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n_00);
      iVar1 = *pvVar6;
      __n = __n_00 + 1;
      pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n);
      if (*pvVar6 <= iVar1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n_00);
        iVar1 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n);
        if (iVar1 != *pvVar6) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n_00);
          vVar3 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n);
          vVar2 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n_00);
          *pvVar6 = vVar2;
          pvVar6 = std::vector<int,_std::allocator<int>_>::at(sortArray,__n);
          *pvVar6 = (int)(char)vVar3;
        }
      }
    }
  }
  clock();
  poVar7 = std::operator<<((ostream *)&std::cout,"Total time was ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7," processor cycles.");
  std::endl<char,std::char_traits<char>>(poVar7);
  return;
}

Assistant:

void BubbleSort(std::vector<int> *sortArray)
{
    std::clock_t t;
    t = clock();
    for(int i = sortArray->size() - 1; i > - 1; i--)
    {
        for(int j = 0; j < i; j++)
        {
            if(sortArray->at(j) < sortArray->at(j + 1) || sortArray->at(j) == sortArray->at(j + 1))
            {
                continue;
            }
            else
            {
                char tmp = sortArray->at(j);
                sortArray->at(j) = sortArray->at(j + 1);
                sortArray->at(j + 1) = tmp;
            }
        }
    }

    t = clock() - t;
    std::cout << "Total time was " << t << " processor cycles." << std::endl;
}